

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

reference __thiscall
slang::SmallVectorBase<std::array<char,2ul>>::emplace_back<std::array<char,2ul>const&>
          (SmallVectorBase<std::array<char,_2UL>_> *this,array<char,_2UL> *args)

{
  iterator paVar1;
  undefined2 *in_RSI;
  SmallVectorBase<std::array<char,_2UL>_> *in_RDI;
  array<char,_2UL> *in_stack_00000020;
  pointer in_stack_00000028;
  SmallVectorBase<std::array<char,_2UL>_> *in_stack_00000030;
  pointer local_8;
  
  if (in_RDI->len == in_RDI->cap) {
    SmallVectorBase<std::array<char,_2UL>_>::end(in_RDI);
    local_8 = emplaceRealloc<std::array<char,2ul>const&>
                        (in_stack_00000030,in_stack_00000028,in_stack_00000020);
  }
  else {
    paVar1 = SmallVectorBase<std::array<char,_2UL>_>::end(in_RDI);
    *(undefined2 *)paVar1->_M_elems = *in_RSI;
    in_RDI->len = in_RDI->len + 1;
    local_8 = SmallVectorBase<std::array<char,_2UL>_>::back(in_RDI);
  }
  return local_8;
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }